

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

int __thiscall NavierStokesBase::nghost_state(NavierStokesBase *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  EBFactory((NavierStokesBase *)0x517253);
  bVar1 = amrex::EBFArrayBoxFactory::isAllRegular((EBFArrayBoxFactory *)0x51725b);
  if (bVar1) {
    bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
    local_4 = 3;
    if (bVar1) {
      local_4 = 2;
    }
  }
  else {
    local_4 = 4;
  }
  return local_4;
}

Assistant:

int
NavierStokesBase::nghost_state ()
{
#ifdef AMREX_USE_EB
  if (!EBFactory().isAllRegular())
  {
        return 4;
  }
  else
#endif
  {
    return (advection_scheme == "MOL" ) ? 2 : 3;
}
}